

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

mallinfo * mspace_mallinfo(mallinfo *__return_storage_ptr__,mspace msp)

{
  mstate ms;
  mspace msp_local;
  
  internal_mallinfo(__return_storage_ptr__,(mstate)msp);
  return __return_storage_ptr__;
}

Assistant:

struct mallinfo mspace_mallinfo(mspace msp) {
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return internal_mallinfo(ms);
}